

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

void __thiscall ans_byte_encode::ans_byte_encode(ans_byte_encode *this)

{
  void *in_RDI;
  undefined8 local_10;
  
  memset(in_RDI,0,0x200);
  memset((void *)((long)in_RDI + 0x200),0,0x1000);
  local_10 = (long)in_RDI + 0x210;
  do {
    local_10 = local_10 + 0x10;
  } while (local_10 != (long)in_RDI + 0x1200);
  return;
}

Assistant:

static ans_byte_encode create(const uint8_t* in_u8, size_t n)
    {
        ans_byte_encode model;
        std::array<uint64_t, constants::MAX_SIGMA> freqs { 0 };
        for (size_t i = 0; i < n; i++) {
            freqs[in_u8[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }